

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O1

void multipredict<false>(ftrl *b,base_learner *param_2,example *ec,size_t count,size_t step,
                        polyprediction *pred,bool finalize_predictions)

{
  vw *all;
  polyprediction *ppVar1;
  size_t sVar2;
  float fVar3;
  multipredict_info<sparse_parameters> local_40;
  
  all = b->all;
  ppVar1 = pred;
  sVar2 = count;
  if (count != 0) {
    do {
      ppVar1->scalar = (ec->l).simple.initial;
      sVar2 = sVar2 - 1;
      ppVar1 = ppVar1 + 1;
    } while (sVar2 != 0);
  }
  local_40.count = count;
  local_40.step = step;
  local_40.pred = pred;
  if ((b->all->weights).sparse == false) {
    local_40.weights = (sparse_parameters *)&(all->weights).dense_weights;
    local_40.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,(multipredict_info<dense_parameters> *)&local_40);
  }
  else {
    local_40.weights = &(all->weights).sparse_weights;
    local_40.gravity = (float)all->sd->gravity;
    GD::
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,&local_40);
  }
  ppVar1 = pred;
  sVar2 = count;
  if (count != 0 && all->sd->contraction != 1.0) {
    do {
      ppVar1->scalar = (float)all->sd->contraction * ppVar1->scalar;
      sVar2 = sVar2 - 1;
      ppVar1 = ppVar1 + 1;
    } while (sVar2 != 0);
  }
  if (finalize_predictions && count != 0) {
    do {
      fVar3 = GD::finalize_prediction(all->sd,pred->scalar);
      pred->scalar = fVar3;
      pred = pred + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void multipredict(
    ftrl& b, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *b.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (b.all->weights.sparse)
  {
    GD::multipredict_info<sparse_parameters> mp = {
        count, step, pred, all.weights.sparse_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<sparse_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    GD::multipredict_info<dense_parameters> mp = {count, step, pred, all.weights.dense_weights, (float)all.sd->gravity};
    GD::foreach_feature<GD::multipredict_info<dense_parameters>, uint64_t, GD::vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = GD::finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      GD::print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}